

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageDrawCircle(Image *dst,int centerX,int centerY,int radius,Color color)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int x;
  int y;
  
  if (-1 < radius) {
    iVar2 = radius * -2 + 3;
    iVar4 = 10;
    x = centerX;
    y = centerY;
    iVar3 = 0;
    do {
      ImageDrawPixel(dst,centerX + iVar3,radius + centerY,color);
      ImageDrawPixel(dst,x,radius + centerY,color);
      ImageDrawPixel(dst,centerX + iVar3,centerY - radius,color);
      ImageDrawPixel(dst,x,centerY - radius,color);
      ImageDrawPixel(dst,centerX + radius,centerY + iVar3,color);
      ImageDrawPixel(dst,centerX - radius,centerY + iVar3,color);
      ImageDrawPixel(dst,centerX + radius,y,color);
      ImageDrawPixel(dst,centerX - radius,y,color);
      if (iVar2 < 1) {
        iVar2 = iVar2 + iVar4;
      }
      else {
        radius = radius + -1;
        iVar2 = iVar2 + ((iVar3 + 1) - radius) * 4 + 10;
      }
      iVar4 = iVar4 + 4;
      y = y + -1;
      x = x + -1;
      bVar1 = iVar3 < radius;
      iVar3 = iVar3 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void ImageDrawCircle(Image *dst, int centerX, int centerY, int radius, Color color)
{
    int x = 0, y = radius;
    int decesionParameter = 3 - 2*radius;

    while (y >= x)
    {
        ImageDrawPixel(dst, centerX + x, centerY + y, color);
        ImageDrawPixel(dst, centerX - x, centerY + y, color);
        ImageDrawPixel(dst, centerX + x, centerY - y, color);
        ImageDrawPixel(dst, centerX - x, centerY - y, color);
        ImageDrawPixel(dst, centerX + y, centerY + x, color);
        ImageDrawPixel(dst, centerX - y, centerY + x, color);
        ImageDrawPixel(dst, centerX + y, centerY - x, color);
        ImageDrawPixel(dst, centerX - y, centerY - x, color);
        x++;

        if (decesionParameter > 0)
        {
            y--;
            decesionParameter = decesionParameter + 4*(x - y) + 10;
        }
        else decesionParameter = decesionParameter + 4*x + 6;
    }
}